

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O2

void __thiscall
TEST_MockParameterTest_expectOneDoubleParameterAndValue_Test::testBody
          (TEST_MockParameterTest_expectOneDoubleParameterAndValue_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleString SStack_38;
  SimpleString local_28;
  SimpleString local_18;
  
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_18,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_18);
  SimpleString::SimpleString(&local_28,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x88))
            (0x3ff0000000000000,(long *)CONCAT44(extraout_var,iVar1),&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_18,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_18);
  SimpleString::SimpleString(&local_28,"parameter");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x70))
            (0x3ff0000000000000,(long *)CONCAT44(extraout_var_00,iVar1),&local_28);
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::~SimpleString(&SStack_38);
  SimpleString::SimpleString(&SStack_38,"");
  pMVar2 = mock(&SStack_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&SStack_38);
  return;
}

Assistant:

TEST(MockParameterTest, expectOneDoubleParameterAndValue)
{
    mock().expectOneCall("foo").withParameter("parameter", 1.0);
    mock().actualCall("foo").withParameter("parameter", 1.0);

    mock().checkExpectations();
}